

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_SAA_Reg(VGMPlayer *this)

{
  CHIP_DEVICE *pCVar1;
  
  pCVar1 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar1 != (CHIP_DEVICE *)0x0) && (pCVar1->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    (*pCVar1->write8)((pCVar1->base).defInf.dataPtr,'\x01',
                      this->_fileData[(ulong)this->_filePos + 1] & 0x7f);
    (*pCVar1->write8)((pCVar1->base).defInf.dataPtr,'\0',this->_fileData[(ulong)this->_filePos + 2])
    ;
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_SAA_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	cDev->write8(cDev->base.defInf.dataPtr, 0x01, fData[0x01] & 0x7F);	// SAA commands are at offset 1, not 0
	cDev->write8(cDev->base.defInf.dataPtr, 0x00, fData[0x02]);
	return;
}